

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NewFunctionProcessingVisitor.cpp
# Opt level: O2

void __thiscall
NewFunctionProcessingVisitor::Visit
          (NewFunctionProcessingVisitor *this,ArithmeticalExpression *expression)

{
  int iVar1;
  bool bVar2;
  int iVar3;
  int iVar4;
  Value *pVVar5;
  PrimitiveSimpleObject *pPVar6;
  Type *pTVar7;
  int iVar8;
  string *psVar9;
  allocator<char> local_79;
  VariableValue *local_78;
  string local_70;
  string local_50;
  
  if (&expression->lhs_->super_Node == (Node *)0x0) {
    pVVar5 = TemplateVisitor<Value_*>::Accept
                       (&this->super_TemplateVisitor<Value_*>,&expression->rhs_->super_Node);
    iVar8 = (*pVVar5->_vptr_Value[2])(pVVar5);
    local_78 = (VariableValue *)operator_new(0x50);
    pPVar6 = (PrimitiveSimpleObject *)operator_new(0x18);
    pTVar7 = (Type *)operator_new(0x28);
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_50,"int",&local_79);
    Type::Type(pTVar7,&local_50);
    PrimitiveSimpleObject::PrimitiveSimpleObject(pPVar6,pTVar7);
    VariableValue::VariableValue(local_78,pPVar6,-iVar8);
    (this->super_TemplateVisitor<Value_*>).tos_value_ = &local_78->super_Value;
    psVar9 = &local_50;
  }
  else {
    pVVar5 = TemplateVisitor<Value_*>::Accept
                       (&this->super_TemplateVisitor<Value_*>,&expression->lhs_->super_Node);
    iVar3 = (*pVVar5->_vptr_Value[2])(pVVar5);
    pVVar5 = TemplateVisitor<Value_*>::Accept
                       (&this->super_TemplateVisitor<Value_*>,&expression->rhs_->super_Node);
    iVar4 = (*pVVar5->_vptr_Value[2])(pVVar5);
    psVar9 = &expression->operation_;
    bVar2 = std::operator==(psVar9,"+");
    iVar8 = 0;
    if (bVar2) {
      iVar8 = iVar4 + iVar3;
    }
    bVar2 = std::operator==(psVar9,"-");
    iVar1 = iVar3 - iVar4;
    if (!bVar2) {
      iVar1 = iVar8;
    }
    bVar2 = std::operator==(psVar9,"*");
    iVar8 = iVar4 * iVar3;
    if (!bVar2) {
      iVar8 = iVar1;
    }
    bVar2 = std::operator==(psVar9,"/");
    if (bVar2) {
      iVar8 = iVar3 / iVar4;
    }
    bVar2 = std::operator==(psVar9,"%");
    if (bVar2) {
      iVar8 = iVar3 % iVar4;
    }
    local_78 = (VariableValue *)operator_new(0x50);
    pPVar6 = (PrimitiveSimpleObject *)operator_new(0x18);
    pTVar7 = (Type *)operator_new(0x28);
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_70,"int",&local_79);
    Type::Type(pTVar7,&local_70);
    PrimitiveSimpleObject::PrimitiveSimpleObject(pPVar6,pTVar7);
    VariableValue::VariableValue(local_78,pPVar6,iVar8);
    (this->super_TemplateVisitor<Value_*>).tos_value_ = &local_78->super_Value;
    psVar9 = &local_70;
  }
  std::__cxx11::string::~string((string *)psVar9);
  return;
}

Assistant:

void NewFunctionProcessingVisitor::Visit(ArithmeticalExpression* expression) {
  if (expression->lhs_ == nullptr) {
    auto rhs = Accept(expression->rhs_)->GetValue();

    tos_value_ =
        new VariableValue(new PrimitiveSimpleObject(new Type("int")), -rhs);
  } else {
    auto lhs = Accept(expression->lhs_)->GetValue();
    auto rhs = Accept(expression->rhs_)->GetValue();
    int result = 0;

    if (expression->operation_ == "+") {
      result = lhs + rhs;
    }
    if (expression->operation_ == "-") {
      result = lhs - rhs;
    }
    if (expression->operation_ == "*") {
      result = lhs * rhs;
    }
    if (expression->operation_ == "/") {
      result = lhs / rhs;
    }
    if (expression->operation_ == "%") {
      result = lhs % rhs;
    }

    tos_value_ =
        new VariableValue(new PrimitiveSimpleObject(new Type("int")), result);
  }
}